

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

string * cmSystemTools::ComputeFileHash(string *__return_storage_ptr__,string *source,Algo algo)

{
  cmCryptoHash hash;
  cmCryptoHash cStack_28;
  
  cmCryptoHash::cmCryptoHash(&cStack_28,algo);
  cmCryptoHash::HashFile(__return_storage_ptr__,&cStack_28,source);
  cmCryptoHash::~cmCryptoHash(&cStack_28);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::ComputeFileHash(const std::string& source,
                                           cmCryptoHash::Algo algo)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  cmCryptoHash hash(algo);
  return hash.HashFile(source);
#else
  (void)source;
  cmSystemTools::Message("hashsum not supported in bootstrapping mode",
                         "Error");
  return std::string();
#endif
}